

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O2

TreeOrError * __thiscall
slang::syntax::SyntaxTree::fromFile
          (TreeOrError *__return_storage_ptr__,SyntaxTree *this,string_view path,
          SourceManager *sourceManager,Bag *options)

{
  undefined8 uVar1;
  __extent_storage<18446744073709551615UL> _Var2;
  MacroList inheritedMacros;
  span<const_slang::SourceBuffer,_18446744073709551615UL> sources;
  undefined1 local_b8 [40];
  string_view path_local;
  BufferOrError buffer;
  
  path_local._M_str = (char *)path._M_len;
  path_local._M_len = (size_t)this;
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            ((path *)local_b8,&path_local,auto_format);
  SourceManager::readSource
            (&buffer,(SourceManager *)path._M_str,(path *)local_b8,(SourceLibrary *)0x0,
             0xffffffffffffffff);
  std::filesystem::__cxx11::path::~path((path *)local_b8);
  if (buffer.contained.super_storage_t_impl<slang::SourceBuffer,_std::error_code>.m_has_value ==
      false) {
    (__return_storage_ptr__->contained).
    super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    .field_0.m_error.second._M_len = path_local._M_len;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    .field_0.m_error.second._M_str = path_local._M_str;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    .field_0.m_value.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             buffer.contained.super_storage_t_impl<slang::SourceBuffer,_std::error_code>.field_0.
             m_value.data._M_len;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    .field_0.m_value.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         buffer.contained.super_storage_t_impl<slang::SourceBuffer,_std::error_code>.field_0.m_value
         .data._M_str;
  }
  else {
    _Var2._M_extent_value =
         (size_t)nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::value
                           (&buffer);
    inheritedMacros._M_extent._M_extent_value = 0;
    inheritedMacros._M_ptr = (pointer)sourceManager;
    sources._M_extent._M_extent_value = _Var2._M_extent_value;
    sources._M_ptr = (pointer)path._M_str;
    create((SourceManager *)local_b8,sources,(Bag *)0x1,inheritedMacros,false);
    uVar1 = local_b8._8_8_;
    local_b8._8_8_ = 0;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    .field_0.m_value.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)local_b8._0_8_;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    .field_0.m_value.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar1;
    local_b8._0_8_ = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
  }
  (__return_storage_ptr__->contained).
  super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  .m_has_value = buffer.contained.super_storage_t_impl<slang::SourceBuffer,_std::error_code>.
                 m_has_value != false;
  return __return_storage_ptr__;
}

Assistant:

SyntaxTree::TreeOrError SyntaxTree::fromFile(std::string_view path, SourceManager& sourceManager,
                                             const Bag& options) {
    auto buffer = sourceManager.readSource(path, /* library */ nullptr);
    if (!buffer)
        return nonstd::make_unexpected(std::pair{buffer.error(), path});
    return create(sourceManager, std::span(&buffer.value(), 1), options, {}, false);
}